

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall
dynet::SimpleSGDTrainer::update_lookup_params
          (SimpleSGDTrainer *this,real scale,real gscale,size_t idx,size_t lidx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *this_00
  ;
  reference this_01;
  reference pvVar1;
  size_type in_RDX;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *this_02;
  allocator_type *in_stack_ffffffffffffff98;
  undefined1 *puVar2;
  undefined1 local_40 [24];
  const_reference local_28;
  size_type local_20;
  size_type local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  this_00 = Model::lookup_parameters_list((Model *)in_RDI[7]);
  local_28 = std::
             vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
             ::operator[](this_00,local_18);
  this_01 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                      (&(*local_28)->values,local_20);
  pvVar1 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                     (&(*local_28)->grads,local_20);
  puVar2 = &stack0xffffffffffffffa0;
  this_02 = (vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&stack0xffffffffffffff9f;
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xc7f215);
  __l._M_len = (size_type)puVar2;
  __l._M_array = (iterator)pvVar1;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_01,__l,
             in_stack_ffffffffffffff98);
  (**(code **)(*in_RDI + 0x18))(local_c,local_10,in_RDI,local_40);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(this_02);
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xc7f265);
  return;
}

Assistant:

void SimpleSGDTrainer::update_lookup_params(real scale, real gscale, size_t idx, size_t lidx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(scale, gscale, {&p->values[lidx], &p->grads[lidx]});
}